

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O2

char * find_build_path(void)

{
  int iVar1;
  char *__dest;
  char *__s2;
  
  __dest = (char *)malloc(0x6f);
  memcpy(__dest,
         "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]ipc-bench/source/common/process.c"
         ,99);
  for (__s2 = __dest + 0x59; __dest <= __s2; __s2 = __s2 + -1) {
    if ((*__s2 == 'i') && (__s2[8] == 'h')) {
      iVar1 = strncmp("ipc-bench",__s2,9);
      if (iVar1 == 0) break;
    }
  }
  builtin_strncpy(__s2 + 9,"/build/source",0xe);
  return __dest;
}

Assistant:

char *find_build_path() {
	char *path = (char *)malloc(strlen(__FILE__) + strlen(BUILD_PATH));
	char *right;
	char *left;

	strcpy(path, __FILE__);
	right = path + strlen(__FILE__);
	left = right - strlen("ipc-bench");

	// Make the string-comparison expected O(N)
	// by only doing a string-comparison when
	// the first and last character match
	for (--right; left >= path; --left, --right) {
		if (*left == 'i' && *right == 'h') {
			if (strncmp("ipc-bench", left, 9) == 0) {
				break;
			}
		}
	}

	// ++ because right is on the 'h'
	strcpy(++right, BUILD_PATH);

	return path;
}